

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_header.cpp
# Opt level: O3

uint32_t __thiscall pstore::trailer::get_crc(trailer *this)

{
  uint uVar1;
  long lVar2;
  
  uVar1 = 0;
  lVar2 = -0x60;
  do {
    uVar1 = uVar1 >> 8 ^
            *(uint *)(details::crc32_tab +
                     (ulong)(byte)(*(byte *)((long)(&this->signature2 + -1) + lVar2) ^ (byte)uVar1)
                     * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0);
  return ~uVar1;
}

Assistant:

std::uint32_t trailer::get_crc () const noexcept {
        return crc32 (gsl::make_span (&this->a, 1));
    }